

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O0

lu_int basiclu_obj_solve_sparse
                 (basiclu_object *obj,lu_int nzrhs,lu_int *irhs,double *xrhs,char trans)

{
  lu_int lVar1;
  basiclu_object *in_RDI;
  double *in_stack_00000230;
  lu_int *in_stack_00000238;
  double *in_stack_00000240;
  lu_int *in_stack_00000248;
  double *in_stack_00000250;
  lu_int *in_stack_00000258;
  lu_int *in_stack_00000270;
  double *in_stack_00000278;
  lu_int in_stack_00000280;
  lu_int *in_stack_00000288;
  double *in_stack_00000290;
  lu_int *in_stack_00000298;
  lu_int *in_stack_000002a0;
  double *in_stack_000002a8;
  char in_stack_000002b0;
  basiclu_object *in_stack_ffffffffffffff60;
  undefined4 local_2c;
  
  lVar1 = isvalid(in_RDI);
  if (lVar1 == 0) {
    local_2c = -8;
  }
  else {
    lu_clear_lhs(in_stack_ffffffffffffff60);
    local_2c = basiclu_solve_sparse
                         (in_stack_00000258,in_stack_00000250,in_stack_00000248,in_stack_00000240,
                          in_stack_00000238,in_stack_00000230,in_stack_00000270,in_stack_00000278,
                          in_stack_00000280,in_stack_00000288,in_stack_00000290,in_stack_00000298,
                          in_stack_000002a0,in_stack_000002a8,in_stack_000002b0);
  }
  return local_2c;
}

Assistant:

lu_int basiclu_obj_solve_sparse(struct basiclu_object *obj, lu_int nzrhs,
                                const lu_int irhs[], const double xrhs[],
                                char trans)
{
    if (!isvalid(obj))
        return BASICLU_ERROR_invalid_object;

    lu_clear_lhs(obj);
    return basiclu_solve_sparse(obj->istore, obj->xstore, obj->Li, obj->Lx,
                                obj->Ui, obj->Ux, obj->Wi, obj->Wx, nzrhs, irhs,
                                xrhs, &obj->nzlhs, obj->ilhs, obj->lhs, trans);
}